

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_sde.c
# Opt level: O1

void beltSDEStepE(void *buf,size_t count,octet *iv,void *state)

{
  memCopy((octet *)((long)state + 0x48),iv,0x10);
  beltBlockEncr((octet *)((long)state + 0x48),(u32 *)state);
  *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x48);
  *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x50);
  beltWBLStepE(buf,count,state);
  *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x48);
  *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x50);
  return;
}

Assistant:

void beltSDEStepE(void* buf, size_t count, const octet iv[16], void* state)
{
	belt_sde_st* st = (belt_sde_st*)state;
	ASSERT(count % 16 == 0 && count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltSDE_keep()));
	ASSERT(memIsValid(iv, 16));
	// зашифровать синхропосылку
	memCopy(st->s, iv, 16);
	beltBlockEncr(st->s, st->wbl->key);
	// каскад XEX
	beltBlockXor2(buf, st->s);
	beltWBLStepE(buf, count, st->wbl);
	beltBlockXor2(buf, st->s);
}